

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::sinDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *peVar1;
  expr_node *deriv;
  expr_value local_20;
  
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_20,10);
  expr_node::expr_node(this_00,'\x05',&local_20);
  peVar1 = Copy(this_00);
  this_00->right = peVar1;
  Link(this_00,(expr_node *)0x0,this_00->right);
  return this_00;
}

Assistant:

expr_node* expr_tree::sinDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)COS);
    deriv->right = Copy(node->right);
    Link(deriv, nullptr, deriv->right);
    return deriv;
}